

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

_Bool Curl_xfer_is_blocked(Curl_easy *data)

{
  _Bool _Var1;
  bool bVar2;
  bool bVar3;
  _Bool local_1d;
  _Bool local_1c;
  _Bool local_1b;
  _Bool want_recv;
  _Bool want_send;
  Curl_easy *data_local;
  
  bVar2 = ((data->req).keepon & 2U) != 0;
  bVar3 = ((data->req).keepon & 1U) != 0;
  if (bVar2) {
    if (bVar3) {
      _Var1 = Curl_creader_is_paused(data);
      local_1d = false;
      if (_Var1) {
        local_1d = Curl_cwriter_is_paused(data);
      }
      data_local._7_1_ = local_1d;
    }
    else {
      local_1c = false;
      if (bVar2) {
        local_1c = Curl_creader_is_paused(data);
      }
      data_local._7_1_ = local_1c;
    }
  }
  else {
    local_1b = false;
    if (bVar3) {
      local_1b = Curl_cwriter_is_paused(data);
    }
    data_local._7_1_ = local_1b;
  }
  return data_local._7_1_;
}

Assistant:

bool Curl_xfer_is_blocked(struct Curl_easy *data)
{
  bool want_send = ((data)->req.keepon & KEEP_SEND);
  bool want_recv = ((data)->req.keepon & KEEP_RECV);
  if(!want_send)
    return (want_recv && Curl_cwriter_is_paused(data));
  else if(!want_recv)
    return (want_send && Curl_creader_is_paused(data));
  else
    return Curl_creader_is_paused(data) && Curl_cwriter_is_paused(data);
}